

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tree_element_base
              (nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
              nk_collapse_states initial_state,int *selected,char *hash,int len,int line)

{
  nk_window *win_00;
  int iVar1;
  nk_collapse_states *local_50;
  nk_uint *state;
  nk_hash tree_hash;
  int title_len;
  nk_window *win;
  int *selected_local;
  nk_collapse_states initial_state_local;
  char *title_local;
  nk_image *img_local;
  nk_tree_type type_local;
  nk_context *ctx_local;
  
  win_00 = ctx->current;
  if (hash == (char *)0x0) {
    iVar1 = nk_strlen(title);
    state._0_4_ = nk_murmur_hash(title,iVar1,line);
  }
  else {
    state._0_4_ = nk_murmur_hash(hash,len,line);
  }
  local_50 = nk_find_value(win_00,(nk_hash)state);
  if (local_50 == (nk_collapse_states *)0x0) {
    local_50 = nk_add_value(ctx,win_00,(nk_hash)state,0);
    *local_50 = initial_state;
  }
  iVar1 = nk_strlen(title);
  iVar1 = nk_tree_element_image_push_hashed_base(ctx,type,img,title,iVar1,local_50,selected);
  return iVar1;
}

Assistant:

NK_INTERN int
nk_tree_element_base(struct nk_context *ctx, enum nk_tree_type type,
    struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
    int *selected, const char *hash, int len, int line)
{
    struct nk_window *win = ctx->current;
    int title_len = 0;
    nk_hash tree_hash = 0;
    nk_uint *state = 0;

    /* retrieve tree state from internal widget state tables */
    if (!hash) {
        title_len = (int)nk_strlen(title);
        tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
    } else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
    state = nk_find_value(win, tree_hash);
    if (!state) {
        state = nk_add_value(ctx, win, tree_hash, 0);
        *state = initial_state;
    } return nk_tree_element_image_push_hashed_base(ctx, type, img, title,
        nk_strlen(title), (enum nk_collapse_states*)state, selected);
}